

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.cc
# Opt level: O2

int __thiscall Cleaner::CleanTarget(Cleaner *this,char *target)

{
  State *this_00;
  int iVar1;
  size_t sVar2;
  Node *target_00;
  StringPiece path;
  
  if (target != (char *)0x0) {
    Reset(this);
    this_00 = this->state_;
    sVar2 = strlen(target);
    path.len_ = sVar2;
    path.str_ = target;
    target_00 = State::LookupNode(this_00,path);
    if (target_00 == (Node *)0x0) {
      Error("unknown target \'%s\'",target);
      this->status_ = 1;
      iVar1 = 1;
    }
    else {
      CleanTarget(this,target_00);
      iVar1 = this->status_;
    }
    return iVar1;
  }
  __assert_fail("target",
                "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/clean.cc"
                ,0xad,"int Cleaner::CleanTarget(const char *)");
}

Assistant:

int Cleaner::CleanTarget(const char* target) {
  assert(target);

  Reset();
  Node* node = state_->LookupNode(target);
  if (node) {
    CleanTarget(node);
  } else {
    Error("unknown target '%s'", target);
    status_ = 1;
  }
  return status_;
}